

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O1

NodeAVL * avlBalance(NodeAVL *nd)

{
  NodeAVL *p;
  NodeAVL *pNVar1;
  int iVar2;
  int iVar3;
  
  pNVar1 = nd->left;
  if (pNVar1 == (NodeAVL *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = pNVar1->height;
  }
  p = nd->right;
  if (p == (NodeAVL *)0x0) {
    iVar2 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    nd->height = iVar3 + 1;
  }
  else {
    iVar2 = p->height;
    if (p->height < iVar3) {
      iVar2 = iVar3;
    }
    nd->height = iVar2 + 1;
    iVar2 = p->height;
  }
  if (pNVar1 == (NodeAVL *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = pNVar1->height;
  }
  if (iVar2 - iVar3 == 2) {
    iVar2 = 0;
    iVar3 = 0;
    if (p->right != (NodeAVL *)0x0) {
      iVar3 = p->right->height;
    }
    if (p->left != (NodeAVL *)0x0) {
      iVar2 = p->left->height;
    }
    if (iVar3 < iVar2) {
      pNVar1 = avlRotateRight(p);
      nd->right = pNVar1;
    }
    pNVar1 = avlRotateLeft(nd);
    return pNVar1;
  }
  iVar2 = 0;
  iVar3 = 0;
  if (p != (NodeAVL *)0x0) {
    iVar3 = p->height;
  }
  if (pNVar1 != (NodeAVL *)0x0) {
    iVar2 = pNVar1->height;
  }
  if (iVar3 - iVar2 == -2) {
    iVar2 = 0;
    iVar3 = 0;
    if (pNVar1->right != (NodeAVL *)0x0) {
      iVar3 = pNVar1->right->height;
    }
    if (pNVar1->left != (NodeAVL *)0x0) {
      iVar2 = pNVar1->left->height;
    }
    if (iVar2 < iVar3) {
      pNVar1 = avlRotateLeft(pNVar1);
      nd->left = pNVar1;
    }
    pNVar1 = avlRotateRight(nd);
    return pNVar1;
  }
  return nd;
}

Assistant:

static
NodeAVL* avlBalance( NodeAVL* nd ){
    #ifdef DEBUG_AVL
      printf( "avlBalance id=%d\n", nd->id );
    #endif
    avlFixHeight(nd);
    if( avlBfactor(nd)==2 ){
        if( avlBfactor(nd->right) < 0 ) nd->right = avlRotateRight(nd->right);
        return avlRotateLeft(nd);
    }
    if( avlBfactor(nd)==-2 ){
        if( avlBfactor(nd->left) > 0  ) nd->left = avlRotateLeft(nd->left);
        return avlRotateRight(nd);
    }
    return nd;
}